

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_notch2_config *
ma_notch2_config_init
          (ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double q,double frequency)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_notch2_config *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  if (in_RDI != (ma_notch2_config *)0x0) {
    memset(in_RDI,0,0x20);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRate = in_ECX;
  in_RDI->q = in_XMM0_Qa;
  in_RDI->frequency = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((in_RDI->q == 0.0) && (!NAN(in_RDI->q))) {
    in_RDI->q = 0.707107;
  }
  return in_RDI;
}

Assistant:

MA_API ma_notch2_config ma_notch2_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double q, double frequency)
{
    ma_notch2_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;
    config.q          = q;
    config.frequency  = frequency;

    if (config.q == 0) {
        config.q = 0.707107;
    }

    return config;
}